

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdAddSighashTypeInSchnorrSignature
              (void *handle,char *signature,int sighash_type,bool anyone_can_pay,
              char **added_signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  SchnorrSignature sig;
  SigHashType sighash_type_obj;
  SchnorrSignature local_a0;
  string local_78;
  ByteData local_58;
  SigHashType local_3c;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x2c7;
    local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddSighashTypeInSchnorrSignature";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_a0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_a0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (added_signature != (char **)0x0) {
    std::__cxx11::string::string((string *)&local_78,signature,(allocator *)&local_58);
    cfd::core::SchnorrSignature::SchnorrSignature(&local_a0,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    cfd::core::SigHashType::Create(&local_3c,(uint8_t)sighash_type,anyone_can_pay,false);
    cfd::core::SchnorrSignature::SetSigHashType(&local_a0,&local_3c);
    cfd::core::SchnorrSignature::GetData(&local_58,&local_a0,true);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_78,&local_58);
    pcVar2 = cfd::capi::CreateString(&local_78);
    *added_signature = pcVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x2cd;
  local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdAddSighashTypeInSchnorrSignature";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_a0,kCfdLogLevelWarning,"added_signature is null or empty.")
  ;
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"Failed to parameter. added_signature is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_a0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddSighashTypeInSchnorrSignature(
    void* handle, const char* signature, int sighash_type, bool anyone_can_pay,
    char** added_signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (added_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "added_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. added_signature is null or empty.");
    }
    SchnorrSignature sig(signature);
    SigHashType sighash_type_obj = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), anyone_can_pay);
    sig.SetSigHashType(sighash_type_obj);
    *added_signature = CreateString(sig.GetData(true).GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}